

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::GridRenderCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *pcVar1;
  char *pcVar2;
  ostringstream buf;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 vtx_color;\nuniform highp vec4 u_posScale;\n\n"
             ,0x80);
  if (*(char *)((long)this + 0x80) == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,
               "uniform highp vec4 u_primitiveBBoxMin;\nuniform highp vec4 u_primitiveBBoxMax;\n\nflat out highp float v_"
               ,0x66);
    pcVar2 = SSBOArrayLengthTests::init::arraysSized + 1;
    pcVar1 = SSBOArrayLengthTests::init::arraysSized + 1;
    if (*(byte *)((long)this + 0x81) != 0) {
      pcVar1 = "geo_";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,pcVar1,(ulong)*(byte *)((long)this + 0x81) << 2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,"bbox_expansionSize;\nflat out highp vec3 v_",0x2a);
    pcVar1 = SSBOArrayLengthTests::init::arraysSized + 1;
    if (*(byte *)((long)this + 0x81) != 0) {
      pcVar1 = "geo_";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,pcVar1,(ulong)*(byte *)((long)this + 0x81) << 2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,"bbox_clipMin;\nflat out highp vec3 v_",0x24);
    if (*(byte *)((long)this + 0x81) != 0) {
      pcVar2 = "geo_";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,pcVar2,(ulong)*(byte *)((long)this + 0x81) << 2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,"bbox_clipMax;\n\n",0xf);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "void main()\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\tgl_Position = vec4(a_position.xy * patternScale + patternOffset, a_position.z, a_position.w);\n\tvtx_color = a_color;\n"
             ,0xd8);
  if (*(char *)((long)this + 0x80) == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"\n\tv_",4);
    pcVar2 = SSBOArrayLengthTests::init::arraysSized + 1;
    pcVar1 = SSBOArrayLengthTests::init::arraysSized + 1;
    if (*(byte *)((long)this + 0x81) != 0) {
      pcVar1 = "geo_";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,pcVar1,(ulong)*(byte *)((long)this + 0x81) << 2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,"bbox_expansionSize = 0.0;\n\tv_",0x1d);
    pcVar1 = SSBOArrayLengthTests::init::arraysSized + 1;
    if (*(byte *)((long)this + 0x81) != 0) {
      pcVar1 = "geo_";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,pcVar1,(ulong)*(byte *)((long)this + 0x81) << 2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,
               "bbox_clipMin =\n\t    min(vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMin.w,\n\t        vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMax.w);\n\tv_"
               ,0xe3);
    if (*(byte *)((long)this + 0x81) != 0) {
      pcVar2 = "geo_";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,pcVar2,(ulong)*(byte *)((long)this + 0x81) << 2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198,
               "bbox_clipMax =\n\t    min(vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMin.w,\n\t        vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMax.w);\n"
               ,0xe0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string GridRenderCase::genVertexSource (void) const
{
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"in highp vec4 a_position;\n"
			"in highp vec4 a_color;\n"
			"out highp vec4 vtx_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"\n";
	if (!m_hasTessellationStage)
	{
		DE_ASSERT(m_useGlobalState);
		buf <<	"uniform highp vec4 u_primitiveBBoxMin;\n"
				"uniform highp vec4 u_primitiveBBoxMax;\n"
				"\n"
				"flat out highp float v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_expansionSize;\n"
				"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin;\n"
				"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax;\n"
				"\n";
	}

	buf <<	"void main()\n"
			"{\n"
			"	highp vec2 patternOffset = u_posScale.xy;\n"
			"	highp vec2 patternScale = u_posScale.zw;\n"
			"	gl_Position = vec4(a_position.xy * patternScale + patternOffset, a_position.z, a_position.w);\n"
			"	vtx_color = a_color;\n";

	if (!m_hasTessellationStage)
	{
		DE_ASSERT(m_useGlobalState);
		buf <<	"\n"
				"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_expansionSize = 0.0;\n"
				"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin =\n"
				"	    min(vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMin.w,\n"
				"	        vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMax.w);\n"
				"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax =\n"
				"	    min(vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMin.w,\n"
				"	        vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMax.w);\n";
	}

	buf<<	"}\n";

	return buf.str();
}